

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

CURLcode singleipconnect(connectdata *conn,Curl_addrinfo *ai,curl_socket_t *sockp)

{
  SessionHandle *pSVar1;
  curl_sockopt_callback p_Var2;
  long lVar3;
  _Bool _Var4;
  ushort uVar5;
  CURLcode CVar6;
  int iVar7;
  int iVar8;
  if2ip_result_t iVar9;
  size_t sVar10;
  uint *puVar11;
  int *piVar12;
  curl_socket_t *pcVar13;
  uint uVar14;
  if2ip_result_t iVar15;
  ulong uVar16;
  char *pcVar17;
  char *fmt;
  curl_socket_t __fd;
  socklen_t __len;
  byte *__s;
  int iVar18;
  SessionHandle *data;
  timeval tVar19;
  curl_socket_t sockfd;
  Curl_dns_entry *h;
  undefined4 local_31c;
  SessionHandle *local_318;
  curl_socket_t *local_310;
  socklen_t local_304;
  long port;
  Curl_sockaddr_storage sa;
  char ipaddress [46];
  char myhost [256];
  Curl_sockaddr_ex addr;
  Curl_sockaddr_storage add;
  
  data = conn->data;
  *sockp = -1;
  pcVar13 = &sockfd;
  CVar6 = Curl_socket(conn,ai,&addr,pcVar13);
  if (CVar6 != CURLE_OK) {
    return CURLE_OK;
  }
  _Var4 = getaddressinfo(&addr._sa_ex_u.addr,ipaddress,&port);
  if (!_Var4) {
    puVar11 = (uint *)__errno_location();
    uVar14 = *puVar11;
    pcVar17 = Curl_strerror(conn,uVar14);
    Curl_failf(data,"sa_addr inet_ntop() failed with errno %d: %s",(ulong)uVar14,pcVar17);
    Curl_closesocket(conn,sockfd);
    return CURLE_OK;
  }
  Curl_infof(data,"  Trying %s...\n",ipaddress);
  __fd = sockfd;
  if ((data->set).tcp_nodelay == true) {
    pSVar1 = conn->data;
    pcVar13 = (curl_socket_t *)myhost;
    myhost._0_4_ = ZEXT14((pSVar1->set).tcp_nodelay);
    iVar7 = setsockopt(sockfd,6,1,pcVar13,4);
    if (iVar7 < 0) {
      piVar12 = __errno_location();
      pcVar17 = Curl_strerror(conn,*piVar12);
      Curl_infof(pSVar1,"Could not set TCP_NODELAY: %s\n",pcVar17);
    }
    else {
      Curl_infof(pSVar1,"TCP_NODELAY set\n");
    }
  }
  uVar14 = (uint)(data->set).tcp_keepalive;
  if (uVar14 == 1) {
    pcVar13 = (curl_socket_t *)myhost;
    myhost._0_4_ = uVar14;
    iVar7 = setsockopt(__fd,1,9,pcVar13,4);
    if (iVar7 < 0) {
      pcVar17 = "Failed to set SO_KEEPALIVE on fd %d\n";
    }
    else {
      myhost._0_4_ = curlx_sltosi((data->set).tcp_keepidle);
      iVar7 = setsockopt(__fd,6,4,myhost,4);
      if (iVar7 < 0) {
        Curl_infof(data,"Failed to set TCP_KEEPIDLE on fd %d\n",(ulong)(uint)__fd);
      }
      myhost._0_4_ = curlx_sltosi((data->set).tcp_keepintvl);
      pcVar13 = (curl_socket_t *)myhost;
      iVar7 = setsockopt(__fd,6,5,pcVar13,4);
      if (-1 < iVar7) goto LAB_004e8fdd;
      pcVar17 = "Failed to set TCP_KEEPINTVL on fd %d\n";
    }
    Curl_infof(data,pcVar17,(ulong)(uint)__fd);
  }
LAB_004e8fdd:
  p_Var2 = (data->set).fsockopt;
  if ((p_Var2 == (curl_sockopt_callback)0x0) ||
     (iVar7 = (*p_Var2)((data->set).sockopt_client,__fd,CURLSOCKTYPE_IPCXN), iVar7 == 0)) {
    local_31c = 0;
  }
  else {
    local_31c = (undefined4)CONCAT71((int7)((ulong)pcVar13 >> 8),1);
    if (iVar7 != 2) {
      Curl_closesocket(conn,__fd);
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }
  pSVar1 = conn->data;
  h = (Curl_dns_entry *)0x0;
  uVar5 = (pSVar1->set).localport;
  uVar16 = (ulong)uVar5;
  iVar7 = (pSVar1->set).localportrange;
  __s = (byte *)(pSVar1->set).str[5];
  local_310 = sockp;
  memset(myhost,0,0x100);
  if (uVar5 == 0 && __s == (byte *)0x0) goto LAB_004e91e6;
  sa.buffer._112_8_ = 0;
  sa.buffer.sa_stor.__ss_align = 0;
  sa.buffer._96_8_ = 0;
  sa.buffer._104_8_ = 0;
  sa.buffer._80_8_ = 0;
  sa.buffer._88_8_ = 0;
  sa.buffer._64_8_ = 0;
  sa.buffer._72_8_ = 0;
  sa.buffer._48_8_ = 0;
  sa.buffer._56_8_ = 0;
  sa.buffer._32_8_ = 0;
  sa.buffer._40_8_ = 0;
  sa.buffer._16_8_ = 0;
  sa.buffer._24_8_ = 0;
  sa.buffer._0_8_ = 0;
  sa.buffer._8_1_ = '\0';
  sa.buffer._9_1_ = '\0';
  sa.buffer._10_1_ = '\0';
  sa.buffer._11_1_ = '\0';
  sa.buffer._12_1_ = '\0';
  sa.buffer._13_1_ = '\0';
  sa.buffer._14_1_ = '\0';
  sa.buffer._15_1_ = '\0';
  local_318 = data;
  if ((__s == (byte *)0x0) || (sVar10 = strlen((char *)__s), 0xfe < sVar10)) {
    __len = 0;
    if (addr.family == 2) {
LAB_004e910d:
      sa.buffer.sa_in.sin_port = uVar5 << 8 | uVar5 >> 8;
      sa.buffer.sa.sa_family = 2;
      __len = 0x10;
    }
LAB_004e9123:
    while( true ) {
      iVar18 = bind(__fd,(sockaddr *)&sa,__len);
      uVar16 = uVar16 & 0xffff;
      if (-1 < iVar18) break;
      if (iVar7 < 2) {
        puVar11 = (uint *)__errno_location();
        uVar14 = *puVar11;
        (pSVar1->state).os_errno = uVar14;
        pcVar17 = Curl_strerror(conn,uVar14);
        fmt = "bind failed with errno %d: %s";
        goto LAB_004e92dc;
      }
      Curl_infof(pSVar1,"Bind to local port %hu failed, trying next\n",uVar16);
      uVar14 = (int)uVar16 + 1;
      uVar16 = (ulong)uVar14;
      if (sa.buffer.sa.sa_family == 2) {
        uVar5 = (ushort)uVar14;
        sa.buffer.sa_in.sin_port = uVar5 << 8 | uVar5 >> 8;
        sa.buffer.sa.sa_family = 2;
      }
      iVar7 = iVar7 + -1;
    }
    local_304 = 0x80;
    add.buffer._0_8_ = 0;
    add.buffer._8_1_ = '\0';
    add.buffer._9_1_ = '\0';
    add.buffer._10_1_ = '\0';
    add.buffer._11_1_ = '\0';
    add.buffer._12_1_ = '\0';
    add.buffer._13_1_ = '\0';
    add.buffer._14_1_ = '\0';
    add.buffer._15_1_ = '\0';
    add.buffer._16_8_ = 0;
    add.buffer._24_8_ = 0;
    add.buffer._32_8_ = 0;
    add.buffer._40_8_ = 0;
    add.buffer._48_8_ = 0;
    add.buffer._56_8_ = 0;
    add.buffer._64_8_ = 0;
    add.buffer._72_8_ = 0;
    add.buffer._80_8_ = 0;
    add.buffer._88_8_ = 0;
    add.buffer._96_8_ = 0;
    add.buffer._104_8_ = 0;
    add.buffer._112_8_ = 0;
    add.buffer.sa_stor.__ss_align = 0;
    iVar7 = getsockname(__fd,(sockaddr *)&add,&local_304);
    if (-1 < iVar7) {
      Curl_infof(pSVar1,"Local port: %hu\n",uVar16);
      (conn->bits).bound = true;
      data = local_318;
      __fd = sockfd;
LAB_004e91e6:
      curlx_nonblock(__fd,1);
      tVar19 = curlx_tvnow();
      pcVar13 = local_310;
      conn->connecttime = tVar19;
      if (1 < conn->num_addr) {
        Curl_expire_latest(data,conn->timeoutms_per_addr);
      }
      if ((((char)local_31c == '\0') && (conn->socktype == 1)) &&
         (iVar7 = connect(__fd,(sockaddr *)&addr._sa_ex_u.addr,addr.addrlen), iVar7 == -1)) {
        piVar12 = __errno_location();
        iVar7 = *piVar12;
        if ((iVar7 != 0xb) && (iVar7 != 0x73)) {
          pcVar17 = Curl_strerror(conn,iVar7);
          Curl_infof(data,"Immediate connect fail for %s: %s\n",ipaddress,pcVar17);
          (data->state).os_errno = iVar7;
          Curl_closesocket(conn,__fd);
          return CURLE_COULDNT_CONNECT;
        }
      }
      *pcVar13 = __fd;
      return CURLE_OK;
    }
    puVar11 = (uint *)__errno_location();
    uVar14 = *puVar11;
    (pSVar1->state).os_errno = uVar14;
    pcVar17 = Curl_strerror(conn,uVar14);
    fmt = "getsockname() failed with errno %d: %s";
LAB_004e92dc:
    Curl_failf(pSVar1,fmt,(ulong)uVar14,pcVar17);
  }
  else {
    iVar18 = *__s - 0x69;
    if ((iVar18 == 0) && (iVar18 = __s[1] - 0x66, iVar18 == 0)) {
      iVar18 = 0x21 - (uint)__s[2];
    }
    else {
      iVar18 = -iVar18;
    }
    if (iVar18 != 0) {
      iVar8 = strncmp("host!",(char *)__s,5);
      if (iVar8 != 0) goto LAB_004e9375;
      __s = __s + 5;
      goto LAB_004e945b;
    }
    __s = __s + 3;
LAB_004e9375:
    iVar9 = Curl_if2ip(addr.family,conn->scope,(char *)__s,myhost,0x100);
    if (iVar9 == IF2IP_FOUND) {
      Curl_infof(pSVar1,"Local Interface %s is ip %s using address family %i\n",__s,myhost,
                 (ulong)(uint)addr.family);
      sVar10 = strlen((char *)__s);
      iVar18 = setsockopt(__fd,1,0x19,__s,(int)sVar10 + 1);
      if (iVar18 != 0) {
        puVar11 = (uint *)__errno_location();
        uVar14 = *puVar11;
        pcVar17 = Curl_strerror(conn,uVar14);
        Curl_infof(pSVar1,"SO_BINDTODEVICE %s failed with errno %d: %s; will do regular bind\n",__s,
                   (ulong)uVar14,pcVar17);
      }
LAB_004e94ef:
      __len = 0;
      if ((addr.family == 2) &&
         (iVar18 = inet_pton(2,myhost,(void *)((long)&sa.buffer + 4)), 0 < iVar18))
      goto LAB_004e910d;
      goto LAB_004e9123;
    }
    if (iVar9 == IF2IP_AF_NOT_SUPPORTED) goto LAB_004e92ef;
    if (iVar9 == IF2IP_NOT_FOUND) {
      if (iVar18 != 0) {
LAB_004e945b:
        lVar3 = conn->ip_version;
        if (addr.family == 2) {
          conn->ip_version = 1;
        }
        Curl_resolv(conn,(char *)__s,0,&h);
        conn->ip_version = lVar3;
        if (h != (Curl_dns_entry *)0x0) {
          Curl_printable_address(h->addr,myhost,0x100);
          Curl_infof(pSVar1,"Name \'%s\' family %i resolved to \'%s\' family %i\n",__s,
                     (ulong)(uint)addr.family,myhost,(ulong)(uint)h->addr->ai_family);
          Curl_resolv_unlock(pSVar1,h);
          goto LAB_004e94ef;
        }
        goto LAB_004e951e;
      }
      pcVar17 = "Couldn\'t bind to interface \'%s\'";
    }
    else {
      if (iVar18 != 0) goto LAB_004e945b;
LAB_004e951e:
      pcVar17 = "Couldn\'t bind to \'%s\'";
    }
    Curl_failf(pSVar1,pcVar17,__s);
  }
  iVar9 = 0x2d;
LAB_004e92ef:
  Curl_closesocket(conn,sockfd);
  iVar15 = IF2IP_NOT_FOUND;
  if (iVar9 != IF2IP_AF_NOT_SUPPORTED) {
    iVar15 = iVar9;
  }
  return iVar15;
}

Assistant:

static CURLcode
singleipconnect(struct connectdata *conn,
                const Curl_addrinfo *ai,
                curl_socket_t *sockp)
{
  struct Curl_sockaddr_ex addr;
  int rc;
  int error = 0;
  bool isconnected = FALSE;
  struct SessionHandle *data = conn->data;
  curl_socket_t sockfd;
  CURLcode res = CURLE_OK;
  char ipaddress[MAX_IPADR_LEN];
  long port;

  *sockp = CURL_SOCKET_BAD;

  res = Curl_socket(conn, ai, &addr, &sockfd);
  if(res)
    /* Failed to create the socket, but still return OK since we signal the
       lack of socket as well. This allows the parent function to keep looping
       over alternative addresses/socket families etc. */
    return CURLE_OK;

  /* store remote address and port used in this connection attempt */
  if(!getaddressinfo((struct sockaddr*)&addr.sa_addr,
                     ipaddress, &port)) {
    /* malformed address or bug in inet_ntop, try next address */
    error = ERRNO;
    failf(data, "sa_addr inet_ntop() failed with errno %d: %s",
          error, Curl_strerror(conn, error));
    Curl_closesocket(conn, sockfd);
    return CURLE_OK;
  }
  infof(data, "  Trying %s...\n", ipaddress);

  if(data->set.tcp_nodelay)
    tcpnodelay(conn, sockfd);

  nosigpipe(conn, sockfd);

  Curl_sndbufset(sockfd);

  if(data->set.tcp_keepalive)
    tcpkeepalive(data, sockfd);

  if(data->set.fsockopt) {
    /* activate callback for setting socket options */
    error = data->set.fsockopt(data->set.sockopt_client,
                               sockfd,
                               CURLSOCKTYPE_IPCXN);

    if(error == CURL_SOCKOPT_ALREADY_CONNECTED)
      isconnected = TRUE;
    else if(error) {
      Curl_closesocket(conn, sockfd); /* close the socket and bail out */
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }

  /* possibly bind the local end to an IP, interface or port */
  res = bindlocal(conn, sockfd, addr.family);
  if(res) {
    Curl_closesocket(conn, sockfd); /* close socket and bail out */
    if(res == CURLE_UNSUPPORTED_PROTOCOL) {
      /* The address family is not supported on this interface.
         We can continue trying addresses */
      return CURLE_OK;
    }
    return res;
  }

  /* set socket non-blocking */
  curlx_nonblock(sockfd, TRUE);

  conn->connecttime = Curl_tvnow();
  if(conn->num_addr > 1)
    Curl_expire_latest(data, conn->timeoutms_per_addr);

  /* Connect TCP sockets, bind UDP */
  if(!isconnected && (conn->socktype == SOCK_STREAM)) {
    rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
    if(-1 == rc)
      error = SOCKERRNO;
  }
  else {
    *sockp = sockfd;
    return CURLE_OK;
  }

#ifdef ENABLE_IPV6
  conn->bits.ipv6 = (addr.family == AF_INET6)?TRUE:FALSE;
#endif

  if(-1 == rc) {
    switch(error) {
    case EINPROGRESS:
    case EWOULDBLOCK:
#if defined(EAGAIN)
#if (EAGAIN) != (EWOULDBLOCK)
      /* On some platforms EAGAIN and EWOULDBLOCK are the
       * same value, and on others they are different, hence
       * the odd #if
       */
    case EAGAIN:
#endif
#endif
      res = CURLE_OK;
      break;

    default:
      /* unknown error, fallthrough and try another address! */
      infof(data, "Immediate connect fail for %s: %s\n",
            ipaddress, Curl_strerror(conn,error));
      data->state.os_errno = error;

      /* connect failed */
      Curl_closesocket(conn, sockfd);
      res = CURLE_COULDNT_CONNECT;
    }
  }

  if(!res)
    *sockp = sockfd;

  return res;
}